

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_plt_brick_zone
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  FILE *pFVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  REF_INT ldim_00;
  undefined8 uVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  FILE *file_00;
  double *pdVar14;
  long lVar15;
  double dVar16;
  double maxdata;
  double mindata;
  REF_GLOB *l2c;
  double tempdata;
  int dataformat;
  int connsharing;
  int varsharing;
  int passive;
  float zonemarker;
  REF_GLOB nnode;
  REF_LONG ncell;
  double local_b0;
  double local_a8;
  REF_GLOB *local_a0;
  double local_98;
  uint local_8c;
  double *local_88;
  ulong local_80;
  FILE *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  ulong local_60;
  long local_58;
  long local_50;
  REF_CELL local_48;
  ulong local_40;
  double *local_38;
  
  uVar5 = (ulong)(uint)ldim;
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_64 = 0x43958000;
  local_8c = 2;
  local_68 = 0;
  local_6c = 0;
  local_70 = 0xffffffff;
  local_78 = (FILE *)file;
  uVar3 = ref_grid_compact_cell_nodes(ref_grid,ref_cell,&local_58,&local_50,&local_a0);
  pFVar2 = local_78;
  if (uVar3 == 0) {
    local_80 = uVar5;
    if ((local_58 < 1) || (local_50 < 1)) {
LAB_0012c828:
      if (local_a0 == (REF_GLOB *)0x0) {
        return 0;
      }
      free(local_a0);
      return 0;
    }
    if (ref_mpi->id == 0) {
      sVar4 = fwrite(&local_64,4,1,local_78);
      if (sVar4 != 1) {
        pcVar13 = "zonemarker";
        uVar6 = 0x1053;
LAB_0012c8ed:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar6,"ref_gather_plt_brick_zone",pcVar13,1,sVar4);
        return 1;
      }
      local_88 = scalar;
      if (-3 < (int)local_80) {
        iVar10 = 0;
        if (0 < (int)local_80 + 2) {
          iVar10 = (int)local_80 + 2;
        }
        iVar10 = iVar10 + 1;
        do {
          sVar4 = fwrite(&local_8c,4,1,pFVar2);
          if (sVar4 != 1) {
            pcVar13 = "int";
            uVar6 = 0x1056;
            goto LAB_0012c8ed;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      sVar4 = fwrite(&local_68,4,1,pFVar2);
      if (sVar4 != 1) {
        pcVar13 = "int";
        uVar6 = 0x1059;
        goto LAB_0012c8ed;
      }
      sVar4 = fwrite(&local_6c,4,1,pFVar2);
      if (sVar4 != 1) {
        pcVar13 = "int";
        uVar6 = 0x105a;
        goto LAB_0012c8ed;
      }
      sVar4 = fwrite(&local_70,4,1,pFVar2);
      scalar = local_88;
      if (sVar4 != 1) {
        pcVar13 = "int";
        uVar6 = 0x105b;
        goto LAB_0012c8ed;
      }
    }
    lVar11 = 0;
    lVar15 = 0;
    local_88 = scalar;
    local_48 = ref_cell;
    do {
      local_a8 = 1e+200;
      local_b0 = -1e+200;
      local_98 = 1e+200;
      if (0 < (long)ref_node->max) {
        lVar12 = 0;
        local_98 = 1e+200;
        dVar16 = -1e+200;
        lVar7 = lVar11;
        do {
          if ((local_a0[lVar12] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar12])) {
            dVar1 = *(double *)((long)ref_node->real + lVar7);
            if (dVar1 <= local_98) {
              local_98 = dVar1;
            }
            dVar1 = *(double *)((long)ref_node->real + lVar7);
            local_b0 = dVar16;
            local_a8 = local_98;
            if (dVar16 <= dVar1) {
              dVar16 = dVar1;
              local_b0 = dVar1;
            }
          }
          lVar12 = lVar12 + 1;
          lVar7 = lVar7 + 0x78;
        } while (ref_node->max != lVar12);
      }
      uVar3 = ref_mpi_min(ref_mpi,&local_98,&local_a8,3);
      if (uVar3 != 0) {
        pcVar13 = "mpi min";
        uVar6 = 0x1068;
        goto LAB_0012c1ee;
      }
      local_98 = local_b0;
      uVar3 = ref_mpi_max(ref_mpi,&local_98,&local_b0,3);
      pFVar2 = local_78;
      if (uVar3 != 0) {
        pcVar13 = "mpi max";
        uVar6 = 0x106a;
        goto LAB_0012c1ee;
      }
      if (ref_mpi->id == 0) {
        sVar4 = fwrite(&local_a8,8,1,local_78);
        if (sVar4 != 1) {
          pcVar13 = "mindata";
          uVar6 = 0x106c;
          goto LAB_0012c8ed;
        }
        sVar4 = fwrite(&local_b0,8,1,pFVar2);
        if (sVar4 != 1) {
          pcVar13 = "maxdata";
          uVar6 = 0x106d;
          goto LAB_0012c8ed;
        }
      }
      lVar15 = lVar15 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar15 != 3);
    ldim_00 = (REF_INT)local_80;
    if (0 < ldim_00) {
      uVar5 = local_80 & 0xffffffff;
      uVar9 = 0;
      pdVar14 = local_88;
      local_40 = uVar5;
      do {
        local_a8 = 1e+200;
        local_b0 = -1e+200;
        local_98 = 1e+200;
        if (0 < (long)ref_node->max) {
          lVar11 = 0;
          local_98 = 1e+200;
          dVar16 = -1e+200;
          pdVar8 = pdVar14;
          do {
            if ((local_a0[lVar11] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar11])) {
              dVar1 = *pdVar8;
              if (dVar1 <= local_98) {
                local_98 = dVar1;
              }
              local_b0 = dVar16;
              local_a8 = local_98;
              if (dVar16 <= dVar1) {
                dVar16 = dVar1;
                local_b0 = dVar1;
              }
            }
            lVar11 = lVar11 + 1;
            pdVar8 = pdVar8 + uVar5;
          } while (ref_node->max != lVar11);
        }
        local_60 = uVar9;
        local_38 = pdVar14;
        uVar3 = ref_mpi_min(ref_mpi,&local_98,&local_a8,3);
        if (uVar3 != 0) {
          pcVar13 = "mpi min";
          uVar6 = 0x107a;
          goto LAB_0012c1ee;
        }
        local_98 = local_b0;
        uVar3 = ref_mpi_max(ref_mpi,&local_98,&local_b0,3);
        pFVar2 = local_78;
        if (uVar3 != 0) {
          pcVar13 = "mpi max";
          uVar6 = 0x107c;
          goto LAB_0012c1ee;
        }
        if (ref_mpi->id == 0) {
          sVar4 = fwrite(&local_a8,8,1,local_78);
          if (sVar4 != 1) {
            pcVar13 = "mindata";
            uVar6 = 0x107e;
            goto LAB_0012c8ed;
          }
          sVar4 = fwrite(&local_b0,8,1,pFVar2);
          if (sVar4 != 1) {
            pcVar13 = "maxdata";
            uVar6 = 0x107f;
            goto LAB_0012c8ed;
          }
        }
        uVar9 = local_60 + 1;
        pdVar14 = local_38 + 1;
        ldim_00 = (REF_INT)local_80;
      } while (uVar9 != local_40);
    }
    pFVar2 = local_78;
    file_00 = (FILE *)(ulong)local_8c;
    uVar3 = ref_gather_node_tec_block
                      (ref_node,local_58,local_a0,ldim_00,local_88,local_8c,(FILE *)local_78);
    if (uVar3 == 0) {
      uVar3 = ref_gather_brick_tec(ref_node,local_48,local_50,local_a0,(REF_BOOL)pFVar2,file_00);
      if (uVar3 == 0) goto LAB_0012c828;
      pcVar13 = "c2n";
      uVar6 = 0x1088;
    }
    else {
      pcVar13 = "block points";
      uVar6 = 0x1085;
    }
  }
  else {
    pcVar13 = "l2c";
    uVar6 = 0x104c;
  }
LAB_0012c1ee:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
         "ref_gather_plt_brick_zone",(ulong)uVar3,pcVar13);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_brick_zone(REF_GRID ref_grid,
                                                    REF_CELL ref_cell,
                                                    REF_INT ldim,
                                                    REF_DBL *scalar,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");

  RSS(ref_gather_brick_tec(ref_node, ref_cell, ncell, l2c, REF_TRUE, file),
      "c2n");

  ref_free(l2c);
  return REF_SUCCESS;
}